

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int derive_resumption_secret(ptls_key_schedule_t *sched,uint8_t *secret,ptls_iovec_t nonce)

{
  ptls_key_schedule_t *in_RDX;
  char *in_RSI;
  void *in_RDI;
  int ret;
  char *in_stack_000000a8;
  size_t in_stack_000000b0;
  void *in_stack_000000b8;
  ptls_hash_algorithm_t *in_stack_000000c0;
  undefined1 in_stack_000000c8 [16];
  undefined1 in_stack_000000e0 [16];
  char *in_stack_000000f0;
  int local_24;
  
  local_24 = derive_secret(in_RDX,in_RDI,in_RSI);
  if (local_24 == 0) {
    ptls_iovec_init(in_RSI,*(size_t *)(*(long *)((long)in_RDI + 0x58) + 8));
    local_24 = hkdf_expand_label(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
                                 (ptls_iovec_t)in_stack_000000c8,in_stack_000000a8,
                                 (ptls_iovec_t)in_stack_000000e0,in_stack_000000f0);
  }
  if (local_24 != 0) {
    (*ptls_clear_memory)(in_RSI,*(size_t *)(*(long *)((long)in_RDI + 0x58) + 8));
  }
  return local_24;
}

Assistant:

static int derive_resumption_secret(ptls_key_schedule_t *sched, uint8_t *secret, ptls_iovec_t nonce)
{
    int ret;

    if ((ret = derive_secret(sched, secret, "res master")) != 0)
        goto Exit;
    if ((ret = hkdf_expand_label(sched->hashes[0].algo, secret, sched->hashes[0].algo->digest_size,
                                 ptls_iovec_init(secret, sched->hashes[0].algo->digest_size), "resumption", nonce,
                                 sched->hkdf_label_prefix)) != 0)
        goto Exit;

Exit:
    if (ret != 0)
        ptls_clear_memory(secret, sched->hashes[0].algo->digest_size);
    return ret;
}